

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexPacket.cpp
# Opt level: O1

vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> * __thiscall
rr::VertexPacketAllocator::allocArray
          (vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> *__return_storage_ptr__,
          VertexPacketAllocator *this,size_t count)

{
  pointer *pppcVar1;
  char *pcVar2;
  iterator __position;
  long lVar3;
  long lVar4;
  deInt8 *ptr;
  char *local_40;
  VertexPacket *local_38;
  
  if (count == 0) {
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    lVar4 = 0x30;
    if (this->m_numberOfVertexOutputs != 0) {
      lVar4 = this->m_numberOfVertexOutputs * 0x10 + 0x20;
    }
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_40 = (char *)operator_new__(lVar4 * count);
    lVar3 = 0;
    do {
      local_38 = (VertexPacket *)(local_40 + lVar3);
      pcVar2 = local_40 + lVar3 + 8;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = '\0';
      pcVar2[5] = '\0';
      pcVar2[6] = '\0';
      pcVar2[7] = '\0';
      pcVar2[8] = '\0';
      pcVar2[9] = '\0';
      pcVar2[10] = '\0';
      pcVar2[0xb] = '\0';
      pcVar2[0xc] = '\0';
      pcVar2[0xd] = '\0';
      pcVar2[0xe] = '\0';
      pcVar2[0xf] = '\0';
      pcVar2 = local_40 + lVar3 + 0x20;
      pcVar2[0] = '\0';
      pcVar2[1] = '\0';
      pcVar2[2] = '\0';
      pcVar2[3] = '\0';
      pcVar2[4] = '\0';
      pcVar2[5] = '\0';
      pcVar2[6] = '\0';
      pcVar2[7] = '\0';
      pcVar2[8] = '\0';
      pcVar2[9] = '\0';
      pcVar2[10] = '\0';
      pcVar2[0xb] = '\0';
      pcVar2[0xc] = '\0';
      pcVar2[0xd] = '\0';
      pcVar2[0xe] = '\0';
      pcVar2[0xf] = '\0';
      std::vector<rr::VertexPacket*,std::allocator<rr::VertexPacket*>>::
      emplace_back<rr::VertexPacket*>
                ((vector<rr::VertexPacket*,std::allocator<rr::VertexPacket*>> *)
                 __return_storage_ptr__,&local_38);
      lVar3 = lVar3 + lVar4;
      count = count - 1;
    } while (count != 0);
    __position._M_current =
         (this->m_allocations).super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_allocations).super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<signed_char*,std::allocator<signed_char*>>::_M_realloc_insert<signed_char*const&>
                ((vector<signed_char*,std::allocator<signed_char*>> *)&this->m_allocations,
                 __position,&local_40);
    }
    else {
      *__position._M_current = local_40;
      pppcVar1 = &(this->m_allocations).
                  super__Vector_base<signed_char_*,_std::allocator<signed_char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VertexPacket*> VertexPacketAllocator::allocArray (size_t count)
{
	if (!count)
		return std::vector<VertexPacket*>();

	const size_t extraVaryings	= (m_numberOfVertexOutputs == 0) ? (0) : (m_numberOfVertexOutputs-1);
	const size_t packetSize		= sizeof(VertexPacket) + extraVaryings * sizeof(GenericVec4);

	std::vector<VertexPacket*>	retVal;
	deInt8*						ptr = new deInt8[packetSize * count]; // throws bad_alloc => ok

	// *.push_back might throw bad_alloc
	try
	{
		// run ctors
		for (size_t i = 0; i < count; ++i)
			retVal.push_back(new (ptr + i*packetSize) VertexPacket()); // throws bad_alloc

		m_allocations.push_back(ptr); // throws bad_alloc
	}
	catch (std::bad_alloc& )
	{
		delete [] ptr;
		throw;
	}

	return retVal;
}